

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTest<CheckedSharedMutexTest,_testing::internal::TemplateSel<CheckedSharedMutexTest_TryLockReaderDeadlock_Test>,_testing::internal::Types<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  type_info *ptVar3;
  long *test_suite_name;
  _Alloc_hider type_param;
  int iVar4;
  long *plVar5;
  char *pcVar6;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  long *plVar7;
  ulong uVar8;
  type_info *ptVar9;
  type_info *ptVar10;
  allocator local_162;
  allocator local_161;
  type_info *local_160;
  long local_158;
  type_info local_150 [8];
  undefined8 uStack_148;
  type_info *local_140;
  long local_138;
  type_info local_130 [8];
  undefined8 uStack_128;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  CodeLocation local_98;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_100 = type_names;
  std::__cxx11::string::string((string *)local_50,prefix,&local_162);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
  local_f8 = &local_e8;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_e8 = *plVar7;
    lStack_e0 = plVar5[3];
  }
  else {
    local_e8 = *plVar7;
    local_f8 = (long *)*plVar5;
  }
  local_f0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_d8 = &local_c8;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_c8 = *plVar7;
    lStack_c0 = plVar5[3];
  }
  else {
    local_c8 = *plVar7;
    local_d8 = (long *)*plVar5;
  }
  local_d0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_b8 = &local_a8;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_a8 = *plVar7;
    lStack_a0 = plVar5[3];
  }
  else {
    local_a8 = *plVar7;
    local_b8 = (long *)*plVar5;
  }
  local_b0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b8,
                              (ulong)(local_100->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[index]._M_dataplus.
                                     _M_p);
  local_120 = &local_110;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_110 = *plVar7;
    lStack_108 = plVar5[3];
  }
  else {
    local_110 = *plVar7;
    local_120 = (long *)*plVar5;
  }
  test_suite_name = local_120;
  local_118 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar6 = strchr(test_names,0x2c);
  if (pcVar6 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_160,test_names,&local_161);
  }
  else {
    local_160 = local_150;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,test_names,pcVar6);
  }
  local_140 = local_160;
  if (local_158 != 0) {
    ptVar9 = local_160 + local_158;
    do {
      ptVar3 = local_160;
      iVar4 = isspace((uint)(byte)ptVar9[-1]);
      local_140 = ptVar3;
      if (iVar4 == 0) break;
      ptVar10 = ptVar9 + -1;
      uVar8 = (long)ptVar10 - (long)ptVar3;
      std::__cxx11::string::_M_erase((ulong)&local_160,uVar8);
      ptVar9 = local_160 + uVar8;
      local_140 = local_160;
    } while (ptVar10 != ptVar3);
  }
  local_160 = local_150;
  if (local_140 == local_160) {
    uStack_128 = uStack_148;
    local_140 = local_130;
  }
  ptVar9 = local_140;
  local_138 = local_158;
  local_158 = 0;
  local_150[0] = (type_info)0x0;
  GetTypeName_abi_cxx11_
            (&local_70,
             (internal *)
             &yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::typeinfo,
             local_160);
  type_param._M_p = local_70._M_dataplus._M_p;
  paVar1 = &local_98.file.field_2;
  pcVar2 = (code_location->file)._M_dataplus._M_p;
  local_98.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + (code_location->file)._M_string_length);
  local_98.line = code_location->line;
  set_up_tc = SuiteApiResolver<CheckedSharedMutexTest_TryLockReaderDeadlock_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>_>
              ::GetSetUpCaseOrSuite((code_location->file)._M_dataplus._M_p,local_98.line);
  tear_down_tc = SuiteApiResolver<CheckedSharedMutexTest_TryLockReaderDeadlock_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>_>
                 ::GetTearDownCaseOrSuite
                           ((code_location->file)._M_dataplus._M_p,code_location->line);
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00209808;
  MakeAndRegisterTestInfo
            ((char *)test_suite_name,(char *)ptVar9,type_param._M_p,(char *)0x0,&local_98,
             &TypeIdHelper<CheckedSharedMutexTest<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>>>
              ::dummy_,set_up_tc,tear_down_tc,factory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.file._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_140 != local_130) {
    operator_delete(local_140);
  }
  if (local_160 != local_150) {
    operator_delete(local_160);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return true;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }